

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void laguerre_poly_coef(int n,double *c)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  bool bVar9;
  
  if (-1 < n) {
    uVar2 = (ulong)(uint)n;
    lVar1 = uVar2 + 1;
    pdVar4 = c;
    for (lVar6 = 0; pdVar7 = pdVar4, lVar5 = lVar1, lVar6 != lVar1; lVar6 = lVar6 + 1) {
      while (lVar5 != 0) {
        *pdVar7 = 0.0;
        pdVar7 = pdVar7 + uVar2 + 1;
        lVar5 = lVar5 + -1;
      }
      pdVar4 = pdVar4 + 1;
    }
    for (lVar6 = 0; lVar1 != lVar6; lVar6 = lVar6 + 1) {
      c[lVar6] = 1.0;
    }
    if (n != 0) {
      c[uVar2 + 2] = -1.0;
      lVar6 = (long)(int)lVar1;
      pdVar4 = c + 1;
      for (lVar5 = 2; lVar5 != lVar1; lVar5 = lVar5 + 1) {
        iVar3 = (int)lVar5;
        pdVar7 = pdVar4;
        uVar8 = uVar2;
        while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
          pdVar7[lVar6 + 1] =
               ((pdVar7[lVar6] * (double)(iVar3 * 2 + -1) + pdVar7[lVar6 + -1] * (double)(1 - iVar3)
                ) - *pdVar7) / (double)iVar3;
          pdVar7 = pdVar7 + lVar6;
        }
        pdVar4 = pdVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void laguerre_poly_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_POLY_COEF evaluates the Laguerre polynomial coefficients.
//
//  First terms:
//
//    0: 1
//    1: 1  -1
//    2: 1  -2  1/2
//    3: 1  -3  3/2  1/6
//    4: 1  -4  4   -2/3  1/24
//    5: 1  -5  5   -5/3  5/24  -1/120
//
//  Recursion:
//
//    L(0) = ( 1,  0, 0, ..., 0 )
//    L(1) = ( 1, -1, 0, ..., 0 )
//    L(N) = (2*N-1-X) * L(N-1) - (N-1) * L(N-2) / N
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    01 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Laguerre 
//    polynomials of degree 0 through N.  Each polynomial is stored as a row.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  for ( i = 0; i <= n; i++ )
  {
    c[i+0*(n+1)] = 1.0;
  }

  if ( n == 0 )
  {
    return;
  }

  c[1+1*(n+1)] = -1.0;

  for ( i = 2; i <= n; i++ )
  {
    for ( j = 1; j <= n; j++ )
    {
      c[i+j*(n+1)] = ( 
          double( 2 * i - 1 ) * c[i-1+j*(n+1)] 
        + double(   - i + 1 ) * c[i-2+j*(n+1)] 
        -                          c[i-1+(j-1)*(n+1)] ) 
        / double(i);
    }
 
  }

  return;
}